

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.h
# Opt level: O0

void __thiscall FParser::FParser(FParser *this,DFsScript *scr)

{
  char *pcVar1;
  DFsScript *scr_local;
  FParser *this_local;
  
  svalue_t::svalue_t(&this->t_return);
  FString::FString(&this->t_func);
  this->LineStart = (char *)0x0;
  this->Rover = (char *)0x0;
  pcVar1 = (char *)operator_new__((long)(scr->len + 0x20));
  this->Tokens[0] = pcVar1;
  this->NumTokens = 0;
  this->Script = scr;
  this->PrevSection = (DFsSection *)0x0;
  this->Section = (DFsSection *)0x0;
  this->BraceType = 0;
  return;
}

Assistant:

FParser(DFsScript *scr)
	{
		LineStart = NULL;
		Rover = NULL;
		Tokens[0] = new char[scr->len+32];	// 32 for safety. FS seems to need a few bytes more than the script's actual length.
		NumTokens = 0;
		Script = scr;
		Section = PrevSection = NULL;
		BraceType = 0;
	}